

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

bool loguru::add_file(char *path_in,FileMode mode,Verbosity verbosity)

{
  bool bVar1;
  char *pcVar2;
  FILE *__s;
  int iVar3;
  double __x;
  double __x_00;
  double __x_01;
  char preamble_explain [92];
  char path [4096];
  char local_1088 [96];
  char local_1028 [4096];
  
  if (*path_in == '~') {
    pcVar2 = home_dir();
    snprintf(local_1028,0xfff,"%s%s",pcVar2,path_in + 1);
  }
  else {
    snprintf(local_1028,0xfff,"%s",path_in);
  }
  bVar1 = create_directories(local_1028);
  if (!bVar1) {
    iVar3 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar3 = g_stderr_verbosity;
    }
    if (-3 < iVar3) {
      log(__x);
    }
  }
  pcVar2 = "a";
  if (mode == Truncate) {
    pcVar2 = "w";
  }
  __s = fopen(local_1028,pcVar2);
  if (__s == (FILE *)0x0) {
    iVar3 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar3 = g_stderr_verbosity;
    }
    if (-3 < iVar3) {
      log(__x_00);
    }
  }
  else {
    add_callback(path_in,file_log,__s,verbosity,file_close,file_flush);
    if (mode == Append) {
      fwrite("\n\n\n\n\n",5,1,__s);
    }
    if (DAT_006811d0 != 0) {
      fprintf(__s,"arguments: %s\n",s_arguments_abi_cxx11_);
    }
    if (s_current_dir != '\0') {
      fprintf(__s,"Current dir: %s\n",&s_current_dir);
    }
    pcVar2 = "File verbosity level: %d\n";
    fprintf(__s,"File verbosity level: %d\n",(ulong)(uint)verbosity);
    if (g_preamble == '\x01') {
      print_preamble_header(local_1088,(size_t)pcVar2);
      fprintf(__s,"%s\n",local_1088);
    }
    fflush(__s);
    iVar3 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar3 = g_stderr_verbosity;
    }
    if (g_internal_verbosity <= iVar3) {
      log(__x_01);
    }
  }
  return __s != (FILE *)0x0;
}

Assistant:

bool add_file(const char* path_in, FileMode mode, Verbosity verbosity)
	{
		char path[PATH_MAX];
		if (path_in[0] == '~') {
			snprintf(path, sizeof(path) - 1, "%s%s", home_dir(), path_in + 1);
		} else {
			snprintf(path, sizeof(path) - 1, "%s", path_in);
		}

		if (!create_directories(path)) {
			LOG_F(ERROR, "Failed to create directories to '%s'", path);
		}

		const char* mode_str = (mode == FileMode::Truncate ? "w" : "a");
		auto file = fopen(path, mode_str);
		if (!file) {
			LOG_F(ERROR, "Failed to open '%s'", path);
			return false;
		}
#if LOGURU_WITH_FILEABS
		FileAbs* file_abs = new FileAbs(); // this is deleted in file_close;
		snprintf(file_abs->path, sizeof(file_abs->path) - 1, "%s", path);
		snprintf(file_abs->mode_str, sizeof(file_abs->mode_str) - 1, "%s", mode_str);
		stat(file_abs->path, &file_abs->st);
		file_abs->fp = file;
		file_abs->verbosity = verbosity;
		add_callback(path_in, file_log, file_abs, verbosity, file_close, file_flush);
#else
		add_callback(path_in, file_log, file, verbosity, file_close, file_flush);
#endif

		if (mode == FileMode::Append) {
			fprintf(file, "\n\n\n\n\n");
		}
		if (!s_arguments.empty()) {
			fprintf(file, "arguments: %s\n", s_arguments.c_str());
		}
		if (strlen(s_current_dir) != 0) {
			fprintf(file, "Current dir: %s\n", s_current_dir);
		}
		fprintf(file, "File verbosity level: %d\n", verbosity);
		if (g_preamble) {
			char preamble_explain[LOGURU_PREAMBLE_WIDTH];
			print_preamble_header(preamble_explain, sizeof(preamble_explain));
			fprintf(file, "%s\n", preamble_explain);
		}
		fflush(file);

		VLOG_F(g_internal_verbosity, "Logging to '%s', mode: '%s', verbosity: %d", path, mode_str, verbosity);
		return true;
	}